

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O2

void parse_body(LexState *ls,ExpDesc *e,int needself,BCLine line)

{
  uint8_t *puVar1;
  byte bVar2;
  FuncState *fs_00;
  BCInsLine *pBVar3;
  BCInsLine *pBVar4;
  FuncState *fs_01;
  byte bVar5;
  int iVar6;
  BCReg BVar7;
  BCPos BVar8;
  GCstr *pGVar9;
  GCobj *gc;
  byte bVar10;
  BCReg n;
  ulong uVar11;
  bool bVar12;
  FuncScope bl;
  FuncState fs;
  
  fs_00 = ls->fs;
  pBVar3 = fs_00->bcbase;
  pBVar4 = ls->bcstack;
  fs_init(ls,&fs);
  bl.nactvar = (uint8_t)fs.nactvar;
  bl.flags = '\0';
  bl.vstart = (fs.ls)->vtop;
  bl.prev = fs.bl;
  fs_01 = ls->fs;
  fs.bl = &bl;
  fs.linedefined = line;
  lex_check(ls,0x28);
  bVar12 = needself != 0;
  if (bVar12) {
    pGVar9 = lj_parse_keepstr(ls,"self",4);
    var_new(ls,0,pGVar9);
  }
  n = (BCReg)bVar12;
  iVar6 = ls->tok;
  BVar7 = (uint)bVar12;
  if (iVar6 != 0x29) {
    while( true ) {
      n = BVar7;
      if ((iVar6 != 0x10a) && (iVar6 != 0x11f)) {
        if (iVar6 != 0x118) {
          err_syntax(ls,LJ_ERR_XPARAM);
        }
        lj_lex_next(ls);
        puVar1 = &fs_01->flags;
        *puVar1 = *puVar1 | 2;
        goto LAB_0011eebf;
      }
      pGVar9 = lex_str(ls);
      var_new(ls,n,pGVar9);
      iVar6 = lex_opt(ls,0x2c);
      if (iVar6 == 0) break;
      iVar6 = ls->tok;
      BVar7 = n + 1;
    }
    n = n + 1;
  }
LAB_0011eebf:
  var_add(ls,n);
  bcreg_reserve(fs_01,n);
  lex_check(ls,0x29);
  fs.numparams = (uint8_t)n;
  fs.bcbase = fs_00->bcbase + fs_00->pc;
  fs.bclim = fs_00->bclim - fs_00->pc;
  bcemit_INS(&fs,0x59);
  parse_chunk(ls);
  if (ls->tok != 0x106) {
    lex_match(ls,0x106,0x109,line);
  }
  uVar11 = (long)pBVar3 - (long)pBVar4;
  ls->lastline = ls->linenumber;
  gc = (GCobj *)fs_finish(ls,ls->linenumber);
  fs_00->bcbase = (BCInsLine *)(uVar11 + (long)ls->bcstack);
  fs_00->bclim = ls->sizebcstack - (int)(uVar11 >> 3);
  BVar7 = const_gc(fs_00,gc,0xfffffff8);
  BVar8 = bcemit_INS(fs_00,BVar7 * 0x10000 + 0x33);
  e->k = VRELOCABLE;
  (e->u).s.info = BVar8;
  e->t = 0xffffffff;
  e->f = 0xffffffff;
  bVar2 = fs_00->flags;
  bVar5 = fs.flags & 4 | bVar2;
  bVar10 = bVar2 * '\x02' & 0x40 | bVar5 | 1;
  if ((bVar2 & 1) != 0) {
    bVar10 = bVar5;
  }
  fs_00->flags = bVar10;
  lj_lex_next(ls);
  return;
}

Assistant:

static void parse_body(LexState *ls, ExpDesc *e, int needself, BCLine line)
{
  FuncState fs, *pfs = ls->fs;
  FuncScope bl;
  GCproto *pt;
  ptrdiff_t oldbase = pfs->bcbase - ls->bcstack;
  fs_init(ls, &fs);
  fscope_begin(&fs, &bl, 0);
  fs.linedefined = line;
  fs.numparams = (uint8_t)parse_params(ls, needself);
  fs.bcbase = pfs->bcbase + pfs->pc;
  fs.bclim = pfs->bclim - pfs->pc;
  bcemit_AD(&fs, BC_FUNCF, 0, 0);  /* Placeholder. */
  parse_chunk(ls);
  if (ls->tok != TK_end) lex_match(ls, TK_end, TK_function, line);
  pt = fs_finish(ls, (ls->lastline = ls->linenumber));
  pfs->bcbase = ls->bcstack + oldbase;  /* May have been reallocated. */
  pfs->bclim = (BCPos)(ls->sizebcstack - oldbase);
  /* Store new prototype in the constant array of the parent. */
  expr_init(e, VRELOCABLE,
	    bcemit_AD(pfs, BC_FNEW, 0, const_gc(pfs, obj2gco(pt), LJ_TPROTO)));
#if LJ_HASFFI
  pfs->flags |= (fs.flags & PROTO_FFI);
#endif
  if (!(pfs->flags & PROTO_CHILD)) {
    if (pfs->flags & PROTO_HAS_RETURN)
      pfs->flags |= PROTO_FIXUP_RETURN;
    pfs->flags |= PROTO_CHILD;
  }
  lj_lex_next(ls);
}